

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void test1(void)

{
  socklen_t in_ECX;
  sigslot<void_()> sig;
  undefined1 auStack_98 [16];
  undefined1 local_88 [24];
  __native_type _Stack_70;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_18;
  
  local_88._0_8_ = local_88;
  local_88._16_8_ = 0;
  _Stack_70._0_8_ = 0;
  _Stack_70.__data._8_8_ = (__pthread_internal_list *)0x0;
  _Stack_70.__data._16_8_ = (__pthread_internal_list *)0x0;
  _Stack_70.__data.__list.__prev = (__pthread_internal_list *)0x0;
  _Stack_70.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::_Function_handler<void_(),_HelloWorld>::_M_invoke;
  local_38 = std::_Function_handler<void_(),_HelloWorld>::_M_manager;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  local_88._8_8_ = local_88._0_8_;
  utils::sigslot<void_()>::connect
            ((sigslot<void_()> *)auStack_98,(int)local_88._0_8_,(sockaddr *)&local_48,in_ECX);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_98 + 8));
  utils::detail::slot<void_()>::~slot((slot<void_()> *)&local_48);
  utils::sigslot<void_()>::operator()<>((sigslot<void_()> *)local_88);
  std::__cxx11::
  _List_base<std::shared_ptr<utils::detail::slot<void_()>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_()>_>_>_>
  ::_M_clear((_List_base<std::shared_ptr<utils::detail::slot<void_()>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_()>_>_>_>
              *)local_88);
  return;
}

Assistant:

void test1()
{
    utils::sigslot<void()> sig;
    HelloWorld hello;
    sig.connect(hello);
    sig();
}